

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_353748f::DumpVisitor::onValue(DumpVisitor *this,uint64_t U,bool LEB)

{
  bool LEB_local;
  uint64_t U_local;
  DumpVisitor *this_local;
  
  if (LEB) {
    llvm::encodeULEB128(U,this->OS,0);
  }
  else {
    writeInteger<unsigned_long>
              (U,this->OS,
               (bool)(((this->super_ConstVisitor).super_VisitorImpl<const_llvm::DWARFYAML::Data>.
                      DebugInfo)->IsLittleEndian & 1));
  }
  return;
}

Assistant:

void onValue(const uint64_t U, const bool LEB = false) override {
    if (LEB)
      encodeULEB128(U, OS);
    else
      writeInteger(U, OS, DebugInfo.IsLittleEndian);
  }